

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<unsigned_int> *
wasm::WATParser::fieldidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,HeapTypeT type)

{
  Lexer *this;
  optional<unsigned_int> oVar1;
  string local_78;
  undefined1 local_58 [8];
  optional<wasm::Name> id;
  allocator<char> local_31;
  
  this = &ctx->in;
  oVar1 = Lexer::takeU<unsigned_int>(this);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    Lexer::takeID((optional<wasm::Name> *)local_58,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01') {
      ParseDefsCtx::getFieldFromName(__return_storage_ptr__,ctx,type.type.id,_local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"expected field index or identifier",&local_31);
      Lexer::err((Err *)local_58,this,&local_78);
      std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    ParseDefsCtx::getFieldFromIdx
              (__return_storage_ptr__,ctx,type.type.id,
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}